

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3UnlinkAndDeleteIndex(sqlite3 *db,int iDb,char *zIdxName)

{
  Index *p_00;
  bool bVar1;
  Index *local_38;
  Index *p;
  Hash *pHash;
  Index *pIndex;
  char *zIdxName_local;
  int iDb_local;
  sqlite3 *db_local;
  
  p_00 = (Index *)sqlite3HashInsert(&(db->aDb[iDb].pSchema)->idxHash,zIdxName,(void *)0x0);
  if (p_00 != (Index *)0x0) {
    if (p_00->pTable->pIndex == p_00) {
      p_00->pTable->pIndex = p_00->pNext;
    }
    else {
      local_38 = p_00->pTable->pIndex;
      while( true ) {
        bVar1 = false;
        if (local_38 != (Index *)0x0) {
          bVar1 = local_38->pNext != p_00;
        }
        if (!bVar1) break;
        local_38 = local_38->pNext;
      }
      if ((local_38 != (Index *)0x0) && (local_38->pNext == p_00)) {
        local_38->pNext = p_00->pNext;
      }
    }
    sqlite3FreeIndex(db,p_00);
  }
  db->mDbFlags = db->mDbFlags | 1;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3UnlinkAndDeleteIndex(sqlite3 *db, int iDb, const char *zIdxName){
  Index *pIndex;
  Hash *pHash;

  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  pHash = &db->aDb[iDb].pSchema->idxHash;
  pIndex = sqlite3HashInsert(pHash, zIdxName, 0);
  if( ALWAYS(pIndex) ){
    if( pIndex->pTable->pIndex==pIndex ){
      pIndex->pTable->pIndex = pIndex->pNext;
    }else{
      Index *p;
      /* Justification of ALWAYS();  The index must be on the list of
      ** indices. */
      p = pIndex->pTable->pIndex;
      while( ALWAYS(p) && p->pNext!=pIndex ){ p = p->pNext; }
      if( ALWAYS(p && p->pNext==pIndex) ){
        p->pNext = pIndex->pNext;
      }
    }
    sqlite3FreeIndex(db, pIndex);
  }
  db->mDbFlags |= DBFLAG_SchemaChange;
}